

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_conforming(REF_CAVITY ref_cavity,REF_INT seg,REF_BOOL *conforming)

{
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  REF_DBL area;
  REF_DBL sign_uv_area;
  REF_DBL normdev;
  REF_INT nodes [27];
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  int local_a0;
  REF_INT local_9c;
  
  ref_grid = ref_cavity->ref_grid;
  local_a0 = ref_cavity->surf_node;
  if (local_a0 == -1) {
    local_a0 = ref_cavity->node;
  }
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  *conforming = 0;
  pRVar1 = ref_cavity->s2n;
  lVar4 = (long)(seg * 3);
  local_a8 = pRVar1[lVar4];
  local_a4 = pRVar1[lVar4 + 1];
  local_9c = pRVar1[lVar4 + 2];
  RVar2 = ref_geom_tri_norm_deviation(ref_grid,&local_a8,&local_b0);
  if (RVar2 != 0) {
    *conforming = 0;
    return 0;
  }
  if (local_b0 <= ref_cavity->min_normdev) {
    return 0;
  }
  uVar3 = ref_node_tri_area(ref_node,&local_a8,&local_c8);
  if (uVar3 == 0) {
    if (local_c8 <= ref_node->min_volume) {
      if (ref_cavity->debug != 0) {
        printf("cav confrom area %e lim %e\n");
        return 0;
      }
      return 0;
    }
    if (ref_geom->meshlink != (void *)0x0) {
LAB_001878a2:
      *conforming = 1;
      return 0;
    }
    uVar3 = ref_geom_uv_area(ref_geom,&local_a8,&local_c0);
    if (uVar3 == 0) {
      uVar3 = ref_geom_uv_area_sign(ref_grid,local_9c,&local_b8);
      if (uVar3 == 0) {
        if (local_b8 * local_c0 <= ref_node->min_uv_area) {
          return 0;
        }
        goto LAB_001878a2;
      }
      pcVar6 = "sign";
      uVar5 = 0x708;
    }
    else {
      pcVar6 = "uv area";
      uVar5 = 0x707;
    }
  }
  else {
    pcVar6 = "vol";
    uVar5 = 0x6fa;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar5,
         "ref_cavity_conforming",(ulong)uVar3,pcVar6);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_conforming(REF_CAVITY ref_cavity, REF_INT seg,
                                         REF_BOOL *conforming) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normdev;
  REF_DBL sign_uv_area, uv_area, area;

  node = ref_cavity_seg_node(ref_cavity);

  *conforming = REF_FALSE;

  nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
  nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
  nodes[2] = node;
  nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);

  if (REF_SUCCESS != ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev)) {
    *conforming = REF_FALSE;
    return REF_SUCCESS;
  }
  if (normdev <= ref_cavity_min_normdev(ref_cavity)) return REF_SUCCESS;

  /* for twod, should not hurt 3D */
  RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
  if (area <= ref_node_min_volume(ref_node)) {
    if (ref_cavity_debug(ref_cavity))
      printf("cav confrom area %e lim %e\n", area,
             ref_node_min_volume(ref_node));
    return REF_SUCCESS;
  }

  if (ref_geom_meshlinked(ref_geom)) {
    *conforming = REF_TRUE;
    return REF_SUCCESS;
  }

  RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
  RSS(ref_geom_uv_area_sign(ref_grid, nodes[3], &sign_uv_area), "sign");
  uv_area *= sign_uv_area;

  if (uv_area <= ref_node_min_uv_area(ref_node)) return REF_SUCCESS;

  *conforming = REF_TRUE;

  return REF_SUCCESS;
}